

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::removeOverlap(BoxArray *this,bool simplify)

{
  undefined8 uVar1;
  bool bVar2;
  element_type *peVar3;
  long lVar4;
  Long LVar5;
  Box *this_00;
  size_type sVar6;
  reference pvVar7;
  reference pBVar8;
  int iVar9;
  byte in_SIL;
  Box *in_RDI;
  IntVect IVar10;
  BoxArray nba;
  Box *b_1;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  BoxList bl;
  Box *b;
  iterator __end4;
  iterator __begin4;
  BoxList *__range4;
  Box *bx;
  int N;
  int j;
  int i;
  BoxList bl_diff;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box EmptyBox;
  HashType *BoxHashMap;
  IntVect v;
  BoxArray *in_stack_fffffffffffffcc8;
  BoxArray *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  int in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  int local_304;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  Box *in_stack_fffffffffffffd08;
  BoxArray *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 uVar11;
  BoxList *in_stack_fffffffffffffd60;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> local_228;
  element_type *local_220;
  uint local_214;
  int local_1ec;
  long local_1e8;
  int local_1e0;
  BoxArray *in_stack_fffffffffffffe28;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> local_1b8;
  undefined1 *local_1b0;
  Box *local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  undefined1 local_188 [32];
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_168;
  undefined8 local_14c;
  undefined8 local_144;
  undefined8 local_13c;
  uint local_134;
  Box *local_130;
  int local_128 [2];
  int local_120;
  int local_114;
  int iStack_110;
  int local_10c;
  int local_108 [3];
  undefined8 local_f8;
  int local_f0;
  uint local_e8;
  byte local_e1;
  int *local_d8;
  undefined8 *local_d0;
  int local_c8 [2];
  int local_c0;
  IntVect local_b4;
  uint *local_a8;
  char *local_a0;
  char *local_98;
  long local_90;
  int local_88;
  IntVect *local_80;
  BoxArray *local_78;
  undefined8 local_70;
  int local_68;
  undefined4 local_64;
  int *local_60;
  undefined4 local_54;
  int *local_50;
  undefined4 local_44;
  int *local_40;
  IntVect *local_38;
  undefined8 *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_e1 = in_SIL & 1;
  local_e8 = (uint)ixType(in_stack_fffffffffffffcc8);
  local_a8 = &local_e8;
  if (local_e8 != 0) {
    local_98 = "BoxArray::removeOverlap() supports cell-centered only";
    Abort_host((char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  }
  IVar10 = crseRatio((BoxArray *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  local_108[2] = IVar10.vect[2];
  local_f0 = local_108[2];
  local_108._0_8_ = IVar10.vect._0_8_;
  local_f8._0_4_ = local_108[0];
  local_f8._4_4_ = local_108[1];
  local_108 = IVar10.vect;
  IntVect::IntVect(&local_b4,1);
  local_c0 = local_b4.vect[2];
  local_c8[0] = local_b4.vect[0];
  local_c8[1] = local_b4.vect[1];
  local_120 = local_b4.vect[2];
  local_128[0] = local_b4.vect[0];
  local_128[1] = local_b4.vect[1];
  local_114 = local_b4.vect[0];
  iStack_110 = local_b4.vect[1];
  uVar1 = _local_114;
  local_10c = local_b4.vect[2];
  local_d0 = &local_f8;
  local_d8 = &local_114;
  local_44 = 0;
  local_114 = local_b4.vect[0];
  uVar11 = true;
  if ((int)local_f8 == local_114) {
    local_54 = 1;
    iStack_110 = local_b4.vect[1];
    uVar11 = true;
    local_50 = local_d8;
    if (local_f8._4_4_ == iStack_110) {
      local_64 = 2;
      uVar11 = local_f0 != local_b4.vect[2];
      local_60 = local_d8;
    }
  }
  _local_114 = uVar1;
  local_40 = local_d8;
  if ((bool)uVar11 != false) {
    local_a0 = "BoxArray::removeOverlap() must have m_crse_ratio == 1";
    Abort_host((char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  }
  uniqify(in_stack_fffffffffffffe28);
  peVar3 = std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0xfcf75c);
  local_130 = (Box *)&peVar3->hash;
  Box::Box((Box *)in_stack_fffffffffffffcd0);
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0xfcf782);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffffcc8);
  for (local_198 = 0; lVar4 = (long)local_198, LVar5 = size((BoxArray *)0xfcf7b6), lVar4 < LVar5;
      local_198 = local_198 + 1) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfcf7d8);
    this_00 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                        ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
    bVar2 = Box::ok(this_00);
    if (bVar2) {
      std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0xfcf80a);
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffffcd0,
                 (size_type)in_stack_fffffffffffffcc8);
      intersections(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                    (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      local_19c = 0;
      sVar6 = std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
              ::size(&local_168);
      local_1a0 = (int)sVar6;
      for (; local_19c < local_1a0; local_19c = local_19c + 1) {
        pvVar7 = std::
                 vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                 operator[](&local_168,(long)local_19c);
        if (pvVar7->first != local_198) {
          std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0xfcf8cf);
          std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          operator[](&local_168,(long)local_19c);
          local_1a8 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                 in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
          std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          operator[](&local_168,(long)local_19c);
          boxDiff(in_stack_fffffffffffffd60,in_RDI,(Box *)CONCAT17(uVar11,in_stack_fffffffffffffd50)
                 );
          *(undefined8 *)(local_1a8->smallend).vect = local_14c;
          *(undefined8 *)((local_1a8->smallend).vect + 2) = local_144;
          *(undefined8 *)((local_1a8->bigend).vect + 1) = local_13c;
          (local_1a8->btype).itype = local_134;
          local_1b0 = local_188;
          local_1b8._M_current = (Box *)BoxList::begin((BoxList *)in_stack_fffffffffffffcc8);
          BoxList::end((BoxList *)in_stack_fffffffffffffcc8);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                     *)in_stack_fffffffffffffcd0,
                                    (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                     *)in_stack_fffffffffffffcc8), bVar2) {
            pBVar8 = __gnu_cxx::
                     __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                     ::operator*(&local_1b8);
            std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0xfcf9f0);
            std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                      ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (value_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
            in_stack_fffffffffffffd08 = local_130;
            in_stack_fffffffffffffd10 = (BoxArray *)Box::smallEnd(pBVar8);
            peVar3 = std::
                     __shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0xfcfa32);
            local_80 = &peVar3->crsn;
            local_20 = *(int *)((long)&(in_stack_fffffffffffffd10->m_bat).m_op + 4);
            lVar4 = *(long *)&in_stack_fffffffffffffd10->m_bat;
            local_30 = &local_70;
            local_70._0_4_ = (int)lVar4;
            local_8 = (int)local_70;
            local_c = local_80->vect[0];
            local_4 = local_8;
            if (local_c != 1) {
              if (local_c == 2) {
                if ((int)local_70 < 0) {
                  local_70._0_4_ = (int)local_70 + 1;
                  if ((int)local_70 < 1) {
                    local_70._0_4_ = -(int)local_70;
                  }
                  in_stack_fffffffffffffd04 = -(int)local_70 / 2 + -1;
                  local_4 = in_stack_fffffffffffffd04;
                }
                else {
                  in_stack_fffffffffffffd04 = (int)local_70 / 2;
                  local_4 = in_stack_fffffffffffffd04;
                }
              }
              else if (local_c == 4) {
                if ((int)local_70 < 0) {
                  local_70._0_4_ = (int)local_70 + 1;
                  if ((int)local_70 < 1) {
                    local_70._0_4_ = -(int)local_70;
                  }
                  in_stack_fffffffffffffd00 = -(int)local_70 / 4 + -1;
                  local_4 = in_stack_fffffffffffffd00;
                }
                else {
                  in_stack_fffffffffffffd00 = (int)local_70 / 4;
                  local_4 = in_stack_fffffffffffffd00;
                }
              }
              else {
                if ((int)local_70 < 0) {
                  local_70._0_4_ = (int)local_70 + 1;
                  if ((int)local_70 < 1) {
                    local_70._0_4_ = -(int)local_70;
                  }
                  local_304 = -(int)local_70 / local_c + -1;
                }
                else {
                  local_304 = (int)local_70 / local_c;
                }
                local_4 = local_304;
              }
            }
            local_70._4_4_ = (int)((ulong)lVar4 >> 0x20);
            local_14 = local_70._4_4_;
            local_70 = lVar4;
            local_70._0_4_ = local_4;
            local_18 = (peVar3->crsn).vect[1];
            local_10 = local_14;
            if (local_18 != 1) {
              if (local_18 == 2) {
                if (lVar4 < 0) {
                  iVar9 = local_14 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  in_stack_fffffffffffffcf4 = -iVar9 / 2 + -1;
                  local_10 = in_stack_fffffffffffffcf4;
                }
                else {
                  in_stack_fffffffffffffcf4 = local_14 / 2;
                  local_10 = in_stack_fffffffffffffcf4;
                }
              }
              else if (local_18 == 4) {
                if (lVar4 < 0) {
                  iVar9 = local_14 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  in_stack_fffffffffffffcf0 = -iVar9 / 4 + -1;
                  local_10 = in_stack_fffffffffffffcf0;
                }
                else {
                  in_stack_fffffffffffffcf0 = local_14 / 4;
                  local_10 = in_stack_fffffffffffffcf0;
                }
              }
              else if (lVar4 < 0) {
                iVar9 = local_14 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                in_stack_fffffffffffffcec = -iVar9 / local_18 + -1;
                local_10 = in_stack_fffffffffffffcec;
              }
              else {
                in_stack_fffffffffffffcec = local_14 / local_18;
                local_10 = in_stack_fffffffffffffcec;
              }
            }
            local_70._4_4_ = local_10;
            local_24 = (peVar3->crsn).vect[2];
            local_1c = local_20;
            if (local_24 != 1) {
              if (local_24 == 2) {
                if (local_20 < 0) {
                  iVar9 = local_20 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  in_stack_fffffffffffffce4 = -iVar9 / 2 + -1;
                  local_1c = in_stack_fffffffffffffce4;
                }
                else {
                  in_stack_fffffffffffffce4 = local_20 / 2;
                  local_1c = in_stack_fffffffffffffce4;
                }
              }
              else if (local_24 == 4) {
                if (local_20 < 0) {
                  iVar9 = local_20 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  in_stack_fffffffffffffce0 = -iVar9 / 4 + -1;
                  local_1c = in_stack_fffffffffffffce0;
                }
                else {
                  in_stack_fffffffffffffce0 = local_20 / 4;
                  local_1c = in_stack_fffffffffffffce0;
                }
              }
              else if (local_20 < 0) {
                iVar9 = local_20 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                in_stack_fffffffffffffcdc = -iVar9 / local_24 + -1;
                local_1c = in_stack_fffffffffffffcdc;
              }
              else {
                in_stack_fffffffffffffcdc = local_20 / local_24;
                local_1c = in_stack_fffffffffffffcdc;
              }
            }
            local_68 = local_1c;
            local_88 = local_1c;
            local_90 = local_70;
            local_1e0 = local_1c;
            local_1e8 = local_70;
            local_78 = in_stack_fffffffffffffd10;
            local_38 = local_80;
            in_stack_fffffffffffffcd0 =
                 (BoxArray *)
                 std::
                 unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)in_stack_fffffffffffffcd0,(key_type *)in_stack_fffffffffffffcc8);
            LVar5 = size((BoxArray *)0xfcff20);
            local_1ec = (int)LVar5 + -1;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0,
                       (value_type *)in_stack_fffffffffffffcc8);
            __gnu_cxx::
            __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
            operator++(&local_1b8);
          }
        }
      }
    }
  }
  local_214 = (uint)ixType(in_stack_fffffffffffffcc8);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffffcc8,
                   (IndexType)(uint)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  local_220 = std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0xfcffbe);
  local_228._M_current =
       (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                        ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         in_stack_fffffffffffffcc8);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffffcc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)in_stack_fffffffffffffcd0,
                            (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)in_stack_fffffffffffffcc8), bVar2) {
    pBVar8 = __gnu_cxx::
             __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
             ::operator*(&local_228);
    bVar2 = Box::ok(pBVar8);
    if (bVar2) {
      BoxList::push_back((BoxList *)in_stack_fffffffffffffcd0,(Box *)in_stack_fffffffffffffcc8);
    }
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(&local_228);
  }
  if ((local_e1 & 1) != 0) {
    BoxList::simplify((BoxList *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                      SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0));
  }
  BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
           (BoxList *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  ~BoxArray(in_stack_fffffffffffffcd0);
  BoxList::~BoxList((BoxList *)0xfd00e7);
  BoxList::~BoxList((BoxList *)0xfd00f4);
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  return;
}

Assistant:

void
BoxArray::removeOverlap (bool simplify)
{
    if (! ixType().cellCentered()) {
        amrex::Abort("BoxArray::removeOverlap() supports cell-centered only");
    }

    if (crseRatio() != IntVect::TheUnitVector()) {
        amrex::Abort("BoxArray::removeOverlap() must have m_crse_ratio == 1");
    }

    uniqify();

    BARef::HashType& BoxHashMap = m_ref->hash;

    const Box EmptyBox;

    std::vector< std::pair<int,Box> > isects;
    //
    // Note that "size()" can increase in this loop!!!
    //
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(-1);
    m_ref->updateMemoryUsage_hash(-1);
    Long total_hash_bytes_save = m_ref->total_hash_bytes;
#endif

    BoxList bl_diff;

    for (int i = 0; i < size(); i++)
    {
        if (m_ref->m_abox[i].ok())
        {
            intersections(m_ref->m_abox[i],isects);

            for (int j = 0, N = isects.size(); j < N; j++)
            {
                if (isects[j].first == i) continue;

                Box& bx = m_ref->m_abox[isects[j].first];

                amrex::boxDiff(bl_diff, bx, isects[j].second);

                bx = EmptyBox;

                for (const Box& b : bl_diff)
                {
                    m_ref->m_abox.push_back(b);
                    BoxHashMap[amrex::coarsen(b.smallEnd(),m_ref->crsn)].push_back(size()-1);
                }
            }
        }
    }
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(1);
#endif
    //
    // We now have "holes" in our BoxArray. Make us good.
    //
    BoxList bl(ixType());
    for (const auto& b : m_ref->m_abox) {
        if (b.ok()) {
            bl.push_back(b);
        }
    }

    if (simplify) {
        bl.simplify();
    }

    BoxArray nba(std::move(bl));

    *this = nba;

#ifdef AMREX_MEM_PROFILING
    m_ref->total_hash_bytes = total_hash_bytes_save;
#endif

    BL_ASSERT(isDisjoint());
}